

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall soul::AST::QualifiedIdentifier::~QualifiedIdentifier(QualifiedIdentifier *this)

{
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__QualifiedIdentifier_0032d9b0;
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&(this->pathPrefix).pathSections);
  std::
  vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  ::~vector(&this->pathSections);
  ASTObject::~ASTObject((ASTObject *)this);
  return;
}

Assistant:

QualifiedIdentifier (const Context& c)
            : Expression (ObjectType::QualifiedIdentifier, c, ExpressionKind::unknown)
        {
        }